

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::Add
          (EncodedDescriptorDatabase *this,void *encoded_file_descriptor,int size)

{
  bool bVar1;
  LogMessage *other;
  pair<const_void_*,_int> value;
  LogFinisher local_131;
  LogMessage local_130;
  FileDescriptorProto file;
  
  FileDescriptorProto::FileDescriptorProto(&file);
  bVar1 = MessageLite::ParseFromArray((MessageLite *)&file,encoded_file_descriptor,size);
  if (bVar1) {
    value.second = size;
    value.first = encoded_file_descriptor;
    value._12_4_ = 0;
    bVar1 = SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::AddFile
                      (&this->index_,&file,value);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_130,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x13d);
    other = internal::LogMessage::operator<<
                      (&local_130,
                       "Invalid file descriptor data passed to EncodedDescriptorDatabase::Add().");
    internal::LogFinisher::operator=(&local_131,other);
    internal::LogMessage::~LogMessage(&local_130);
    bVar1 = false;
  }
  FileDescriptorProto::~FileDescriptorProto(&file);
  return bVar1;
}

Assistant:

bool EncodedDescriptorDatabase::Add(
    const void* encoded_file_descriptor, int size) {
  FileDescriptorProto file;
  if (file.ParseFromArray(encoded_file_descriptor, size)) {
    return index_.AddFile(file, std::make_pair(encoded_file_descriptor, size));
  } else {
    GOOGLE_LOG(ERROR) << "Invalid file descriptor data passed to "
                  "EncodedDescriptorDatabase::Add().";
    return false;
  }
}